

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kd_tree.cpp
# Opt level: O2

ANNkd_ptr rkd_tree(ANNpointArray pa,ANNidxArray pidx,int n,int dim,int bsp,ANNorthRect *bnd_box,
                  ANNkd_splitter splitter)

{
  ANNpoint pAVar1;
  ANNpoint pAVar2;
  ANNkd_ptr pAVar3;
  long lVar4;
  ANNkd_ptr pAVar5;
  ANNkd_leaf *pAVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  _func_int **pp_Var10;
  ANNcoord AVar11;
  ANNidxArray pAVar12;
  _func_int **pp_Var13;
  ANNcoord AVar14;
  ANNidxArray pAVar15;
  ANNcoord cv;
  int cd;
  _func_int **local_50;
  ANNcoord local_48;
  int n_lo;
  ANNkd_ptr local_38;
  
  if (bsp < n) {
    (*splitter)(pa,pidx,bnd_box,n,dim,&cd,&cv,&n_lo);
    lVar4 = (long)cd;
    local_50 = (_func_int **)bnd_box->lo[lVar4];
    local_48 = bnd_box->hi[lVar4];
    bnd_box->hi[lVar4] = cv;
    local_38 = rkd_tree(pa,pidx,n_lo,dim,bsp,bnd_box,splitter);
    bnd_box->hi[cd] = local_48;
    bnd_box->lo[cd] = cv;
    pAVar5 = rkd_tree(pa,pidx + n_lo,n - n_lo,dim,bsp,bnd_box,splitter);
    pAVar3 = local_38;
    pAVar1 = bnd_box->lo;
    lVar4 = (long)cd;
    pAVar1[lVar4] = (ANNcoord)local_50;
    if (TreeTopology[lVar4] == 3) {
      pAVar6 = (ANNkd_leaf *)(ulong)(uint)TreeP3Topology[lVar4];
      switch(pAVar6) {
      case (ANNkd_leaf *)0x0:
        pAVar6 = (ANNkd_leaf *)operator_new(0x78);
        iVar7 = cd + 1;
        iVar8 = cd + 2;
        iVar9 = cd + 3;
        pp_Var10 = (_func_int **)pAVar1[lVar4 + 1];
        pAVar2 = bnd_box->hi;
        AVar11 = pAVar2[lVar4 + 1];
        pAVar12 = (ANNidxArray)pAVar1[lVar4 + 2];
        pp_Var13 = (_func_int **)pAVar2[lVar4 + 2];
        AVar14 = pAVar1[lVar4 + 3];
        pAVar15 = (ANNidxArray)pAVar2[lVar4 + 3];
        break;
      case (ANNkd_leaf *)0x1:
        pAVar6 = (ANNkd_leaf *)operator_new(0x78);
        iVar7 = cd + -1;
        iVar8 = cd + 1;
        iVar9 = cd + 2;
        pp_Var10 = (_func_int **)pAVar1[lVar4 + -1];
        pAVar2 = bnd_box->hi;
        AVar11 = pAVar2[lVar4 + -1];
        pAVar12 = (ANNidxArray)pAVar1[lVar4 + 1];
        pp_Var13 = (_func_int **)pAVar2[lVar4 + 1];
        AVar14 = pAVar1[lVar4 + 2];
        pAVar15 = (ANNidxArray)pAVar2[lVar4 + 2];
        break;
      case (ANNkd_leaf *)0x2:
        pAVar6 = (ANNkd_leaf *)operator_new(0x78);
        iVar7 = cd + -2;
        iVar8 = cd + -1;
        iVar9 = cd + 1;
        pp_Var10 = (_func_int **)pAVar1[lVar4 + -2];
        pAVar2 = bnd_box->hi;
        AVar11 = pAVar2[lVar4 + -2];
        pAVar12 = (ANNidxArray)pAVar1[lVar4 + -1];
        pp_Var13 = (_func_int **)pAVar2[lVar4 + -1];
        AVar14 = pAVar1[lVar4 + 1];
        pAVar15 = (ANNidxArray)pAVar2[lVar4 + 1];
        break;
      case (ANNkd_leaf *)0x3:
        pAVar6 = (ANNkd_leaf *)operator_new(0x78);
        iVar7 = cd + -3;
        iVar8 = cd + -2;
        iVar9 = cd + -1;
        pp_Var10 = (_func_int **)pAVar1[lVar4 + -3];
        pAVar2 = bnd_box->hi;
        AVar11 = pAVar2[lVar4 + -3];
        pAVar12 = (ANNidxArray)pAVar1[lVar4 + -2];
        pp_Var13 = (_func_int **)pAVar2[lVar4 + -2];
        AVar14 = pAVar1[lVar4 + -1];
        pAVar15 = (ANNidxArray)pAVar2[lVar4 + -1];
        break;
      default:
        goto switchD_0010656e_default;
      }
      (pAVar6->super_ANNkd_node)._vptr_ANNkd_node = (_func_int **)&PTR__ANNkd_split_0010bd70;
      pAVar6->n_pts = cd;
      pAVar6->bkt = (ANNidxArray)cv;
      pAVar6[1].super_ANNkd_node._vptr_ANNkd_node = local_50;
      *(ANNcoord *)&pAVar6[1].n_pts = local_48;
      pAVar6[1].bkt = (ANNidxArray)pAVar3;
      pAVar6[2].super_ANNkd_node._vptr_ANNkd_node = (_func_int **)pAVar5;
      pAVar6[2].n_pts = iVar7;
      *(int *)&pAVar6[2].field_0xc = iVar8;
      *(int *)&pAVar6[2].bkt = iVar9;
      pAVar6[3].super_ANNkd_node._vptr_ANNkd_node = pp_Var10;
      *(ANNcoord *)&pAVar6[3].n_pts = AVar11;
      pAVar6[3].bkt = pAVar12;
      pAVar6[4].super_ANNkd_node._vptr_ANNkd_node = pp_Var13;
      *(ANNcoord *)&pAVar6[4].n_pts = AVar14;
      pAVar6[4].bkt = pAVar15;
    }
    else {
      pAVar6 = (ANNkd_leaf *)operator_new(0x78);
      (pAVar6->super_ANNkd_node)._vptr_ANNkd_node = (_func_int **)&PTR__ANNkd_split_0010bd70;
      pAVar6->n_pts = cd;
      pAVar6->bkt = (ANNidxArray)cv;
      pAVar6[1].super_ANNkd_node._vptr_ANNkd_node = local_50;
      *(ANNcoord *)&pAVar6[1].n_pts = local_48;
      pAVar6[1].bkt = (ANNidxArray)local_38;
      pAVar6[2].super_ANNkd_node._vptr_ANNkd_node = (_func_int **)pAVar5;
    }
  }
  else {
    pAVar6 = KD_TRIVIAL;
    if (n != 0) {
      pAVar6 = (ANNkd_leaf *)operator_new(0x18);
      (pAVar6->super_ANNkd_node)._vptr_ANNkd_node = (_func_int **)&PTR__ANNkd_node_0010bd30;
      pAVar6->n_pts = n;
      pAVar6->bkt = pidx;
    }
  }
switchD_0010656e_default:
  return &pAVar6->super_ANNkd_node;
}

Assistant:

ANNkd_ptr rkd_tree(           // recursive construction of kd-tree
    ANNpointArray pa,         // point array
    ANNidxArray pidx,         // point indices to store in subtree
    int n,                    // number of points
    int dim,                  // dimension of space
    int bsp,                  // bucket space
    ANNorthRect &bnd_box,     // bounding box for current node
    ANNkd_splitter splitter)  // splitting routine
{
    if (n <= bsp) {             // n small, make a leaf node
        if (n == 0)             // empty leaf node
            return KD_TRIVIAL;  // return (canonical) empty leaf
        else                    // construct the node and return
            return new ANNkd_leaf(n, pidx);
    } else {                  // n large, make a splitting node
        int cd;               // cutting dimension
        ANNcoord cv;          // cutting value
        int n_lo;             // number on low side of cut
        ANNkd_node *lo, *hi;  // low and high children

        // invoke splitting procedure
        (*splitter)(pa, pidx, bnd_box, n, dim, cd, cv, n_lo);

        ANNcoord lv = bnd_box.lo[cd];  // save bounds for cutting dimension
        ANNcoord hv = bnd_box.hi[cd];

        bnd_box.hi[cd] = cv;  // modify bounds for left subtree
        lo = rkd_tree(        // build left subtree
            pa, pidx, n_lo,   // ...from pidx[0..n_lo-1]
            dim, bsp, bnd_box, splitter);
        bnd_box.hi[cd] = hv;  // restore bounds

        bnd_box.lo[cd] = cv;            // modify bounds for right subtree
        hi = rkd_tree(                  // build right subtree
            pa, pidx + n_lo, n - n_lo,  // ...from pidx[n_lo..n-1]
            dim, bsp, bnd_box, splitter);
        bnd_box.lo[cd] = lv;  // restore bounds

        // create the splitting node
        ANNkd_split *ptr;
        if (TreeTopology[cd] == 3) {
            if (TreeP3Topology[cd] == 0)
                ptr = new ANNkd_split(
                    cd, cv, lv, hv, cd + 1, cd + 2, cd + 3, bnd_box.lo[cd + 1],
                    bnd_box.hi[cd + 1], bnd_box.lo[cd + 2], bnd_box.hi[cd + 2],
                    bnd_box.lo[cd + 3], bnd_box.hi[cd + 3], lo, hi);
            if (TreeP3Topology[cd] == 1)
                ptr = new ANNkd_split(
                    cd, cv, lv, hv, cd - 1, cd + 1, cd + 2, bnd_box.lo[cd - 1],
                    bnd_box.hi[cd - 1], bnd_box.lo[cd + 1], bnd_box.hi[cd + 1],
                    bnd_box.lo[cd + 2], bnd_box.hi[cd + 2], lo, hi);
            if (TreeP3Topology[cd] == 2)
                ptr = new ANNkd_split(
                    cd, cv, lv, hv, cd - 2, cd - 1, cd + 1, bnd_box.lo[cd - 2],
                    bnd_box.hi[cd - 2], bnd_box.lo[cd - 1], bnd_box.hi[cd - 1],
                    bnd_box.lo[cd + 1], bnd_box.hi[cd + 1], lo, hi);
            if (TreeP3Topology[cd] == 3)
                ptr = new ANNkd_split(
                    cd, cv, lv, hv, cd - 3, cd - 2, cd - 1, bnd_box.lo[cd - 3],
                    bnd_box.hi[cd - 3], bnd_box.lo[cd - 2], bnd_box.hi[cd - 2],
                    bnd_box.lo[cd - 1], bnd_box.hi[cd - 1], lo, hi);
        } else {
            ptr = new ANNkd_split(cd, cv, lv, hv, lo, hi);
        }

        return ptr;  // return pointer to this node
    }
}